

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O3

word Abc_TtDeriveBiDecOne(word *pTruth,int nVars,int This)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  byte bVar5;
  byte bVar6;
  int iVar7;
  uint *pTruthU;
  ulong uVar8;
  ulong *puVar9;
  uint uVar10;
  ulong *puVar11;
  ulong *puVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  word *pLimit_2;
  ulong uVar17;
  ulong uVar18;
  uint uVar19;
  word pTemp [64];
  word Cof0 [64];
  undefined1 local_638 [512];
  ulong local_438 [64];
  ulong local_238 [65];
  
  uVar10 = Abc_TtBitCount8[This >> 8] + Abc_TtBitCount8[This & 0xff];
  uVar19 = 1 << ((char)nVars - 6U & 0x1f);
  uVar3 = 1;
  if (6 < nVars) {
    uVar3 = uVar19;
  }
  uVar18 = (ulong)uVar3;
  if (0 < (int)uVar3) {
    memcpy(local_638,pTruth,uVar18 * 8);
  }
  if (0 < nVars) {
    uVar4 = 0;
    do {
      if (((uint)This >> ((uint)uVar4 & 0x1f) & 1) != 0) goto LAB_006f9724;
      bVar6 = (byte)(1 << ((byte)uVar4 & 0x1f));
      if (uVar3 == 1) {
        local_438[0] = (s_Truths6Neg[uVar4] & local_638._0_8_) << (bVar6 & 0x3f) |
                       s_Truths6Neg[uVar4] & local_638._0_8_;
        local_238[0] = (local_638._0_8_ & Gia_ManFromIfLogicNode::Truth6[uVar4]) >> (bVar6 & 0x3f) |
                       local_638._0_8_ & Gia_ManFromIfLogicNode::Truth6[uVar4];
LAB_006f9705:
        uVar8 = 0;
        do {
          local_438[uVar8 - 0x40] = local_238[uVar8] | local_438[uVar8];
          uVar8 = uVar8 + 1;
        } while (uVar18 != uVar8);
      }
      else if (uVar4 < 6) {
        if (0 < (int)uVar3) {
          uVar8 = s_Truths6Neg[uVar4];
          uVar17 = 0;
          do {
            local_438[uVar17] =
                 (local_438[uVar17 - 0x40] & uVar8) << (bVar6 & 0x3f) |
                 local_438[uVar17 - 0x40] & uVar8;
            uVar17 = uVar17 + 1;
          } while (uVar18 != uVar17);
LAB_006f97db:
          if (uVar4 < 6) {
            if (0 < (int)uVar3) {
              uVar8 = Gia_ManFromIfLogicNode::Truth6[uVar4];
              uVar17 = 0;
              do {
                local_238[uVar17] =
                     (local_438[uVar17 - 0x40] & uVar8) >> (bVar6 & 0x3f) |
                     local_438[uVar17 - 0x40] & uVar8;
                uVar17 = uVar17 + 1;
              } while (uVar18 != uVar17);
LAB_006f98a3:
              if (0 < (int)uVar3) goto LAB_006f9705;
            }
          }
          else if (0 < (int)uVar3) {
            bVar6 = (byte)(uVar4 - 6);
            uVar14 = 1 << (bVar6 & 0x1f);
            iVar7 = 2 << (bVar6 & 0x1f);
            uVar8 = 1;
            if (1 < (int)uVar14) {
              uVar8 = (ulong)uVar14;
            }
            puVar9 = (ulong *)local_638;
            puVar11 = local_238;
            do {
              if (uVar4 - 6 != 0x1f) {
                uVar17 = 0;
                do {
                  uVar1 = puVar9[(long)(int)uVar14 + uVar17];
                  puVar11[uVar17] = uVar1;
                  puVar11[(long)(int)uVar14 + uVar17] = uVar1;
                  uVar17 = uVar17 + 1;
                } while (uVar8 != uVar17);
              }
              puVar9 = puVar9 + iVar7;
              puVar11 = puVar11 + iVar7;
            } while (puVar9 < local_438 + (long)(int)uVar3 + -0x40);
            goto LAB_006f98a3;
          }
        }
      }
      else if (0 < (int)uVar3) {
        bVar5 = (byte)(uVar4 - 6);
        uVar14 = 1 << (bVar5 & 0x1f);
        iVar7 = 2 << (bVar5 & 0x1f);
        uVar8 = 1;
        if (1 < (int)uVar14) {
          uVar8 = (ulong)uVar14;
        }
        puVar12 = local_438 + (int)uVar14;
        puVar9 = (ulong *)local_638;
        puVar11 = local_438;
        do {
          if (uVar4 - 6 != 0x1f) {
            uVar17 = 0;
            do {
              uVar1 = puVar9[uVar17];
              puVar11[uVar17] = uVar1;
              puVar12[uVar17] = uVar1;
              uVar17 = uVar17 + 1;
            } while (uVar8 != uVar17);
          }
          puVar9 = puVar9 + iVar7;
          puVar12 = puVar12 + iVar7;
          puVar11 = puVar11 + iVar7;
        } while (puVar9 < local_438 + (long)(int)uVar3 + -0x40);
        goto LAB_006f97db;
      }
LAB_006f9724:
      uVar4 = uVar4 + 1;
    } while (uVar4 != (uint)nVars);
    if (0x10 < nVars) {
      __assert_fail("nVarsAll <= 16",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/utilTruth.h"
                    ,0x558,"void Abc_TtShrink(word *, int, int, unsigned int)");
    }
    if (0 < nVars) {
      if ((uint)nVars < 7) {
        uVar19 = 1;
      }
      uVar18 = 0;
      uVar3 = 0;
      do {
        if (((uint)This >> ((uint)uVar18 & 0x1f) & 1) != 0) {
          if ((int)uVar3 < (int)(uint)uVar18) {
            uVar4 = uVar18;
            do {
              uVar8 = uVar4 - 1;
              if ((long)uVar4 < 6) {
                uVar4 = s_PMasks[uVar8][0];
                uVar17 = s_PMasks[uVar8][1];
                uVar1 = s_PMasks[uVar8][2];
                uVar13 = 0;
                do {
                  uVar2 = local_438[uVar13 - 0x40];
                  bVar6 = (byte)(1 << ((byte)uVar8 & 0x1f));
                  local_438[uVar13 - 0x40] =
                       (uVar2 & uVar1) >> (bVar6 & 0x3f) |
                       (uVar2 & uVar17) << (bVar6 & 0x3f) | uVar2 & uVar4;
                  uVar13 = uVar13 + 1;
                } while (uVar19 != uVar13);
              }
              else if (uVar8 == 5) {
                puVar9 = (ulong *)local_638;
                do {
                  *(ulong *)((long)puVar9 + 4) =
                       CONCAT44((int)*(undefined8 *)((long)puVar9 + 4),
                                (int)((ulong)*(undefined8 *)((long)puVar9 + 4) >> 0x20));
                  puVar9 = puVar9 + 2;
                } while (puVar9 < local_438 + ((ulong)uVar19 - 0x40));
              }
              else {
                uVar14 = 1 << ((char)uVar4 - 7U & 0x1f);
                if (uVar4 < 8) {
                  uVar14 = 1;
                }
                iVar7 = uVar14 * 4;
                puVar12 = local_438 + ((ulong)(uVar14 * 2) - 0x40);
                puVar11 = local_438 + ((ulong)uVar14 - 0x40);
                puVar9 = (ulong *)local_638;
                do {
                  if (0 < (int)uVar14) {
                    uVar4 = 0;
                    do {
                      uVar17 = puVar11[uVar4];
                      puVar11[uVar4] = puVar12[uVar4];
                      puVar12[uVar4] = uVar17;
                      uVar4 = uVar4 + 1;
                    } while (uVar14 != uVar4);
                  }
                  puVar9 = puVar9 + iVar7;
                  puVar12 = puVar12 + iVar7;
                  puVar11 = puVar11 + iVar7;
                } while (puVar9 < local_438 + ((ulong)uVar19 - 0x40));
              }
              uVar4 = uVar8;
            } while ((long)(int)uVar3 < (long)uVar8);
          }
          uVar3 = uVar3 + 1;
        }
        uVar18 = uVar18 + 1;
      } while (uVar18 != (uint)nVars);
      goto LAB_006f9a2e;
    }
  }
  uVar3 = 0;
LAB_006f9a2e:
  if (uVar3 != uVar10) {
    __assert_fail("Var == nVars",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/utilTruth.h"
                  ,0x560,"void Abc_TtShrink(word *, int, int, unsigned int)");
  }
  if ((int)uVar10 < 0) {
    __assert_fail("nVars >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/utilTruth.h"
                  ,0x30d,"word Abc_Tt6Stretch(word, int)");
  }
  uVar19 = 2;
  if (2 < uVar10) {
    uVar19 = uVar10;
  }
  uVar3 = 3;
  if (2 < uVar10) {
    uVar3 = uVar19;
  }
  uVar19 = 4;
  if (uVar3 != 3) {
    uVar19 = uVar3;
  }
  uVar14 = 5;
  if (uVar19 != 4) {
    uVar14 = uVar19;
  }
  if (1 < uVar14 - 5) {
    __assert_fail("nVars == 6",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/utilTruth.h"
                  ,0x31a,"word Abc_Tt6Stretch(word, int)");
  }
  uVar15 = (uint)local_638._0_8_;
  uVar16 = -(uVar15 & 1);
  if (uVar10 != 0) {
    uVar16 = uVar15;
  }
  uVar16 = (uVar16 & 3) * 5;
  if (1 < uVar10) {
    uVar16 = uVar15;
  }
  uVar18 = (ulong)((uVar16 & 0xf) << 4 | uVar16 & 0xf);
  if (2 < uVar10) {
    uVar18 = local_638._0_8_;
  }
  uVar4 = (ulong)(uint)((int)(uVar18 & 0xff) << 8) | uVar18 & 0xff;
  if (uVar3 != 3) {
    uVar4 = uVar18;
  }
  uVar18 = (ulong)(uint)((int)uVar4 << 0x10) | uVar4 & 0xffff;
  if (uVar19 != 4) {
    uVar18 = uVar4;
  }
  uVar4 = uVar18 << 0x20 | uVar18 & 0xffffffff;
  if (uVar14 != 5) {
    uVar4 = uVar18;
  }
  return uVar4;
}

Assistant:

static inline word Abc_TtDeriveBiDecOne( word * pTruth, int nVars, int This )
{
    word pTemp[64]; 
    int nThis = Abc_TtBitCount16(This);
    int v, nWords = Abc_TtWordNum(nVars);
    Abc_TtCopy( pTemp, pTruth, nWords, 0 );
    for ( v = 0; v < nVars; v++ )
        if ( !((This >> v) & 1) )
            Abc_TtExist( pTemp, v, nWords );
    Abc_TtShrink( pTemp, nThis, nVars, This );
    return Abc_Tt6Stretch( pTemp[0], nThis );
}